

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_write.c
# Opt level: O3

ares_status_t ares_dns_write_rr_caa(ares_buf_t *buf,ares_dns_rr_t *rr,ares_llist_t **namelist)

{
  ares_status_t aVar1;
  uchar *data;
  size_t data_len;
  size_t local_20;
  
  local_20 = 0;
  aVar1 = ares_dns_write_rr_u8(buf,rr,ARES_RR_CAA_CRITICAL);
  if (aVar1 == ARES_SUCCESS) {
    aVar1 = ares_dns_write_rr_str(buf,rr,ARES_RR_CAA_TAG);
    if (aVar1 == ARES_SUCCESS) {
      data = ares_dns_rr_get_bin(rr,ARES_RR_CAA_VALUE,&local_20);
      aVar1 = ARES_EFORMERR;
      if (local_20 != 0 && data != (uchar *)0x0) {
        aVar1 = ares_buf_append(buf,data,local_20);
      }
    }
  }
  return aVar1;
}

Assistant:

static ares_status_t ares_dns_write_rr_caa(ares_buf_t          *buf,
                                           const ares_dns_rr_t *rr,
                                           ares_llist_t       **namelist)
{
  const unsigned char *data     = NULL;
  size_t               data_len = 0;
  ares_status_t        status;

  (void)namelist;

  /* CRITICAL */
  status = ares_dns_write_rr_u8(buf, rr, ARES_RR_CAA_CRITICAL);
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  /* Tag */
  status = ares_dns_write_rr_str(buf, rr, ARES_RR_CAA_TAG);
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  /* Value - binary! (remaining buffer */
  data = ares_dns_rr_get_bin(rr, ARES_RR_CAA_VALUE, &data_len);
  if (data == NULL || data_len == 0) {
    return ARES_EFORMERR;
  }

  return ares_buf_append(buf, data, data_len);
}